

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runtimes.cpp
# Opt level: O2

size_t fibonacci(size_t N,Runtime *rt)

{
  U *pUVar1;
  atomic<unsigned_long> *paVar2;
  Executor *this;
  Node *pNVar3;
  Topology *pTVar4;
  Node *node;
  size_t sVar5;
  long in_FS_OFFSET;
  size_t res1;
  long local_30;
  
  if (1 < N) {
    LOCK();
    paVar2 = &rt->_parent->_join_counter;
    (paVar2->super___atomic_base<unsigned_long>)._M_i =
         (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    this = rt->_executor;
    pNVar3 = rt->_parent;
    pTVar4 = pNVar3->_topology;
    node = (Node *)operator_new(0xd8);
    node->_nstate = 0;
    node->_estate = (__atomic_base<int>)0x0;
    (node->_name)._M_dataplus._M_p = (pointer)&(node->_name).field_2;
    (node->_name)._M_string_length = 0;
    (node->_name).field_2._M_local_buf[0] = '\0';
    node->_data = (void *)0x0;
    node->_topology = pTVar4;
    node->_parent = pNVar3;
    node->_num_successors = 0;
    pUVar1 = &(node->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    (node->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>
    .super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (node->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>
    .super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (node->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>
    .super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &node->_join_counter;
    (node->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
    *(size_t *)
     &(node->_handle).
      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      ._M_u = N;
    *(long **)((long)&(node->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 8) = &local_30;
    *(code **)((long)&(node->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_runtimes.cpp:99:19)>
         ::_M_invoke;
    *(code **)((long)&(node->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_runtimes.cpp:99:19)>
         ::_M_manager;
    *(undefined1 *)
     ((long)&(node->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x20) = 1;
    *(__index_type *)
     ((long)&(node->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\a';
    (node->_semaphores)._M_t.
    super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
    super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
    (node->_exception_ptr)._M_exception_object = (void *)0x0;
    if (*(Worker **)(in_FS_OFFSET + -8) == (Worker *)0x0) {
      tf::Executor::_schedule(this,node);
    }
    else {
      tf::Executor::_schedule(this,*(Worker **)(in_FS_OFFSET + -8),node);
    }
    sVar5 = fibonacci(N - 2,rt);
    tf::Runtime::corun(rt);
    N = sVar5 + local_30;
  }
  return N;
}

Assistant:

size_t fibonacci(size_t N, tf::Runtime& rt) {

  if (N < 2) {
    return N; 
  }
  
  size_t res1, res2;

  rt.silent_async([N, &res1](tf::Runtime& rt1){ res1 = fibonacci(N-1, rt1); });
  
  // tail optimization
  res2 = fibonacci(N-2, rt);

  // use corun to avoid blocking the worker from waiting the two children tasks to finish
  rt.corun();

  return res1 + res2;
}